

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O3

bool __thiscall MipsMacroCommand::Validate(MipsMacroCommand *this,ValidateState *state)

{
  CAssemblerCommand *pCVar1;
  int iVar2;
  int64_t iVar3;
  int64_t iVar4;
  
  iVar3 = FileManager::getVirtualAddress(g_fileManager);
  CAssemblerCommand::applyFileInfo
            ((this->content)._M_t.
             super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
             super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
             super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl);
  pCVar1 = (this->content)._M_t.
           super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
           super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
           super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
  iVar2 = (*pCVar1->_vptr_CAssemblerCommand[2])(pCVar1,state);
  iVar4 = FileManager::getVirtualAddress(g_fileManager);
  CAssemblerCommand::applyFileInfo(&this->super_CAssemblerCommand);
  if (((this->IgnoreLoadDelay == false) && ((4 < iVar4 - iVar3 & Mips.DelaySlot) == 1)) &&
     ((this->macroFlags & 0x2000) == 0)) {
    Logger::queueError<>(Warning,"Macro with multiple opcodes used inside a delay slot");
  }
  if (iVar4 == iVar3) {
    Logger::queueError<>(Warning,"Empty macro content");
  }
  return SUB41(iVar2,0);
}

Assistant:

bool MipsMacroCommand::Validate(const ValidateState &state)
{
	int64_t memoryPos = g_fileManager->getVirtualAddress();
	content->applyFileInfo();
	bool result = content->Validate(state);
	int64_t newMemoryPos = g_fileManager->getVirtualAddress();

	applyFileInfo();

	if (!IgnoreLoadDelay && Mips.GetDelaySlot() && (newMemoryPos-memoryPos) > 4
		&& (macroFlags & MIPSM_DONTWARNDELAYSLOT) == 0)
	{
		Logger::queueError(Logger::Warning, "Macro with multiple opcodes used inside a delay slot");
	}

	if (newMemoryPos == memoryPos)
		Logger::queueError(Logger::Warning, "Empty macro content");

	return result;
}